

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initRandomVec(HModel *this)

{
  int iVar1;
  reference pvVar2;
  reference __b;
  reference pvVar3;
  long in_RDI;
  double dVar4;
  int i_2;
  int j;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  undefined4 in_stack_fffffffffffffff4;
  int iVar6;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar6 = 0;
  while (iVar6 < *(int *)(in_RDI + 0x614)) {
    iVar5 = iVar6;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8a0),(long)iVar6);
    *pvVar2 = iVar6;
    iVar6 = iVar5 + 1;
  }
  iVar5 = *(int *)(in_RDI + 0x614);
  while (iVar5 = iVar5 + -1, 0 < iVar5) {
    iVar1 = HRandom::intRandom((HRandom *)(in_RDI + 0x70));
    in_stack_ffffffffffffffec = iVar1 % (iVar5 + 1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8a0),(long)iVar5);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8a0),
                     (long)in_stack_ffffffffffffffec);
    std::swap<int>(pvVar2,__b);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar6,iVar5),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x614); iVar6 = iVar6 + 1) {
    dVar4 = HRandom::dblRandom((HRandom *)(in_RDI + 0x70));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b8),(long)iVar6);
    *pvVar3 = dVar4;
  }
  return;
}

Assistant:

void HModel::initRandomVec() {
  intBreak.resize(numTot);
  for (int i = 0; i < numTot; i++)
    intBreak[i] = i;
  for (int i = numTot - 1; i >= 1; i--) {
    int j = random.intRandom() % (i + 1);
    swap(intBreak[i], intBreak[j]);
  }
  dblXpert.resize(numTot);
  for (int i = 0; i < numTot; i++)
    dblXpert[i] = random.dblRandom();
  
}